

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O1

void __thiscall btHashedSimplePairCache::btHashedSimplePairCache(btHashedSimplePairCache *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btSimplePair *ptr;
  undefined8 uVar3;
  btSimplePair *pbVar4;
  long lVar5;
  long lVar6;
  
  this->_vptr_btHashedSimplePairCache = (_func_int **)&PTR__btHashedSimplePairCache_002248f8;
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = (btSimplePair *)0x0;
  (this->m_overlappingPairArray).m_size = 0;
  (this->m_overlappingPairArray).m_capacity = 0;
  (this->m_hashTable).m_ownsMemory = true;
  (this->m_hashTable).m_data = (int *)0x0;
  (this->m_hashTable).m_size = 0;
  (this->m_hashTable).m_capacity = 0;
  (this->m_next).m_ownsMemory = true;
  (this->m_next).m_data = (int *)0x0;
  (this->m_next).m_size = 0;
  (this->m_next).m_capacity = 0;
  pbVar4 = (btSimplePair *)btAlignedAllocInternal(0x20,0x10);
  lVar5 = (long)(this->m_overlappingPairArray).m_size;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)&((this->m_overlappingPairArray).m_data)->m_indexA + lVar6);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pbVar4->m_indexA + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 * 0x10 != lVar6);
  }
  ptr = (this->m_overlappingPairArray).m_data;
  if (ptr != (btSimplePair *)0x0) {
    if ((this->m_overlappingPairArray).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr);
    }
    (this->m_overlappingPairArray).m_data = (btSimplePair *)0x0;
  }
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = pbVar4;
  (this->m_overlappingPairArray).m_capacity = 2;
  growTables(this);
  return;
}

Assistant:

btHashedSimplePairCache::btHashedSimplePairCache() {
	int initialAllocatedSize= 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
	growTables();
}